

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkUnitAddition(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  unit_data uVar2;
  size_t sVar3;
  precise_unit *extraout_RDX;
  precise_unit *extraout_RDX_00;
  precise_unit *result;
  precise_unit *extraout_RDX_01;
  precise_unit *extraout_RDX_02;
  ulong uVar4;
  double dVar5;
  precise_unit pVar6;
  precise_unit local_f0;
  precise_unit local_e0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"+","");
  sVar3 = findOperatorSep(unit_string,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  uVar4 = 0xfa94a488;
  dVar5 = NAN;
  if (0xfffffffffffffffd < sVar3 - 1) goto LAB_0018e67b;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  if ((((pcVar1[sVar3 - 1] == 0x2b) || (sVar3 == unit_string->_M_string_length - 1)) ||
      (pcVar1[sVar3 + 1] == '+')) ||
     ((((byte)(pcVar1[sVar3 - 1] | 0x20U) == 0x65 &&
       (1 < sVar3 && (byte)(pcVar1[sVar3 + 1] - 0x30U) < 10)) &&
      ((byte)(pcVar1[sVar3 - 2] - 0x30U) < 10)))) goto LAB_0018e67b;
  local_f0 = (precise_unit)ZEXT816(0x3ff0000000000000);
  local_e0 = (precise_unit)ZEXT816(0x3ff0000000000000);
  if (sVar3 < unit_string->_M_string_length >> 1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)unit_string);
    local_f0 = unit_from_string_internal(&local_90,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((!NAN(local_f0.multiplier_)) || (local_f0.base_units_ != (unit_data)0xfa94a488)) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)unit_string);
      local_e0 = unit_from_string_internal(&local_b0,match_flags);
      result = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        result = extraout_RDX_00;
      }
      if (NAN(local_e0.multiplier_)) {
        uVar2 = local_e0.base_units_;
joined_r0x0018e640:
        if (uVar2 == (unit_data)0xfa94a488) goto LAB_0018e642;
      }
LAB_0018e64c:
      dVar5 = convert<units::precise_unit,units::precise_unit>
                        ((units *)&local_e0,1.0,&local_f0,result);
      if (!NAN(dVar5)) {
        dVar5 = dVar5 * local_f0.multiplier_ + local_f0.multiplier_;
        uVar4 = (ulong)(uint)local_f0.base_units_;
        goto LAB_0018e67b;
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)unit_string);
    local_e0 = unit_from_string_internal(&local_50,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((!NAN(local_e0.multiplier_)) || (local_e0.base_units_ != (unit_data)0xfa94a488)) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)unit_string);
      local_f0 = unit_from_string_internal(&local_70,match_flags);
      result = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        result = extraout_RDX_02;
      }
      if (NAN(local_f0.multiplier_)) {
        uVar2 = local_f0.base_units_;
        goto joined_r0x0018e640;
      }
      goto LAB_0018e64c;
    }
  }
LAB_0018e642:
  dVar5 = NAN;
LAB_0018e67b:
  pVar6.base_units_ = (unit_data)(int)uVar4;
  pVar6.commodity_ = (int)(uVar4 >> 0x20);
  pVar6.multiplier_ = dVar5;
  return pVar6;
}

Assistant:

static precise_unit
    checkUnitAddition(const std::string& unit_string, std::uint64_t match_flags)
{
    auto sep = findOperatorSep(unit_string, "+");
    if (sep != std::string::npos && sep > 0) {
        if ((unit_string[sep - 1] == '+') || sep == unit_string.size() - 1 ||
            unit_string[sep + 1] == '+') {
            return precise::invalid;
        }
        if (unit_string[sep - 1] == 'e' || unit_string[sep - 1] == 'E') {
            // this is scientific notation not addition
            if (isDigitCharacter(unit_string[sep + 1]) &&
                (sep > 1 && isDigitCharacter(unit_string[sep - 2]))) {
                return precise::invalid;
            }
        }
        precise_unit a_unit;
        precise_unit b_unit;
        if (sep + 1 > unit_string.size() / 2) {
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
        } else {
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
        }
        auto res = convert(b_unit, a_unit);
        if (!std::isnan(res)) {
            return {
                a_unit.multiplier() + a_unit.multiplier() * res,
                a_unit.base_units()};
        }
    }
    return precise::invalid;
}